

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O3

int mp3dec_decode_frame(mp3dec_t *dec,uint8_t *mp3,int mp3_bytes,mp3d_sample_t *pcm,
                       mp3dec_frame_info_t *info)

{
  char *pcVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  byte bVar4;
  ushort uVar5;
  short sVar6;
  short sVar7;
  uint16_t uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  mp3dec_frame_info_t *pmVar39;
  mp3d_sample_t *pmVar40;
  byte bVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  uint32_t uVar45;
  uint32_t uVar46;
  uint *puVar47;
  uint8_t *puVar48;
  undefined8 uVar49;
  byte bVar50;
  uint uVar51;
  uint32_t uVar52;
  ulong uVar53;
  ulong uVar54;
  float *pfVar55;
  float *pfVar56;
  long lVar57;
  bool bVar58;
  byte bVar59;
  uint uVar60;
  float *pfVar61;
  uint8_t uVar62;
  uint uVar63;
  uint uVar64;
  byte *pbVar65;
  L3_gr_info_t *pLVar66;
  undefined1 *puVar67;
  uint uVar68;
  uint uVar69;
  undefined4 *__dest;
  float *pfVar70;
  float *pfVar71;
  undefined1 *puVar72;
  float *pfVar73;
  float (*overlap) [288];
  byte bVar74;
  uint uVar75;
  uint8_t *codebook_count1;
  ulong uVar76;
  uint uVar77;
  uint uVar78;
  long lVar79;
  byte bVar80;
  uint *puVar81;
  uint uVar82;
  bool bVar83;
  float fVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar87;
  undefined1 in_XMM1 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar88;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  int iVar121;
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  int iVar135;
  int iVar139;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  uint8_t scf_size [4];
  bs_t bs_frame [1];
  int frame_size;
  float tmp [18];
  mp3dec_scratch_t scratch;
  float *local_43f0;
  byte *local_43e8;
  undefined1 *local_43d8;
  byte local_43cc [4];
  L3_gr_info_t *local_43c8;
  byte *local_43c0;
  L3_gr_info_t *local_43b8;
  float *local_43b0;
  bs_t local_43a8;
  ulong local_4390;
  int local_4384;
  mp3dec_frame_info_t *local_4380;
  mp3d_sample_t *local_4378;
  ulong local_4370;
  uint8_t *local_4368;
  float *local_4360;
  undefined4 local_4354;
  float *local_4350;
  uint8_t *local_4348;
  ulong local_4340;
  undefined4 local_4338;
  float fStack_4334;
  undefined4 local_4330;
  byte local_4038;
  byte local_4037;
  byte local_4036 [64];
  byte abStack_3ff6 [70];
  bs_t local_3fb0;
  uint8_t local_3fa0 [2816];
  L3_gr_info_t local_34a0 [4];
  float local_3420 [4];
  float afStack_3410 [572];
  undefined1 local_2b20 [16];
  float afStack_2b10 [572];
  float local_2220 [40];
  float local_2180 [2112];
  undefined1 local_80 [39];
  byte local_59 [41];
  
  bVar41 = 0;
  local_4384 = 0;
  local_4380 = info;
  local_4378 = pcm;
  if (((4 < mp3_bytes) && (dec->header[0] == 0xff)) &&
     (iVar42 = hdr_compare(dec->header,mp3), iVar42 != 0)) {
    bVar74 = mp3[1];
    bVar50 = mp3[2];
    iVar43 = hdr_frame_bytes((uint8_t *)(ulong)bVar74,(uint)bVar50);
    iVar42 = 0;
    iVar44 = (uint)((~bVar74 & 6) == 0) * 3 + 1;
    if ((bVar50 & 2) == 0) {
      iVar44 = 0;
    }
    iVar44 = iVar44 + iVar43;
    iVar43 = mp3_bytes;
    local_4384 = iVar44;
    if (iVar44 == mp3_bytes) goto LAB_00143574;
    if ((mp3_bytes < iVar44 + 4) || (iVar43 = hdr_compare(mp3,mp3 + iVar44), iVar43 == 0)) {
      local_4384 = 0;
    }
    else {
      iVar43 = iVar44;
      if (iVar44 != 0) goto LAB_00143574;
    }
  }
  memset(dec,0,0x1a0c);
  iVar42 = mp3d_find_frame(mp3,mp3_bytes,&dec->free_format_bytes,&local_4384);
  iVar43 = local_4384;
  if (mp3_bytes < local_4384 + iVar42 || local_4384 == 0) {
    local_4380->frame_bytes = iVar42;
    return 0;
  }
LAB_00143574:
  *(undefined4 *)dec->header = *(undefined4 *)(mp3 + iVar42);
  local_4380->frame_bytes = iVar43 + iVar42;
  local_4380->frame_offset = iVar42;
  uVar51 = (mp3[(long)iVar42 + 3] < 0xc0) + 1;
  local_4370 = (ulong)uVar51;
  local_4380->channels = uVar51;
  puVar48 = mp3 + iVar42;
  local_4380->hz =
       (*(uint *)(hdr_sample_rate_hz_g_hz + (mp3[(long)iVar42 + 2] & 0xc)) >>
       ((mp3[(long)iVar42 + 1] & 8) == 0)) >> ((mp3[(long)iVar42 + 1] & 0x10) == 0);
  uVar51 = mp3[(long)iVar42 + 1] >> 1 & 3;
  local_4380->layer = 4 - uVar51;
  local_4380->bitrate_kbps =
       (uint)(byte)hdr_bitrate_kbps_halfrate
                   [(ulong)(mp3[(long)iVar42 + 2] >> 4) +
                    (long)(int)((mp3[(long)iVar42 + 1] >> 1 & 3) - 1) * 0xf +
                    (ulong)(mp3[(long)iVar42 + 1] >> 3 & 1) * 0x2d] * 2;
  if (local_4378 == (mp3d_sample_t *)0x0) {
    uVar51 = 0x180;
    if ((~puVar48[1] & 6) != 0) {
      uVar51 = 0x480 >> ((puVar48[1] & 0xe) == 2);
    }
  }
  else {
    local_43a8.buf = puVar48 + 4;
    local_43a8.pos = 0;
    local_43a8.limit = iVar43 * 8 + -0x20;
    bVar74 = puVar48[1];
    if ((bVar74 & 1) == 0) {
      get_bits(&local_43a8,0x10);
    }
    if ((char)uVar51 == '\x01') {
      local_4348 = puVar48;
      iVar43 = L3_read_side_info(&local_43a8,local_34a0,puVar48);
      iVar42 = local_43a8.pos;
      if ((iVar43 < 0) ||
         (iVar44 = local_43a8.limit - local_43a8.pos, local_43a8.limit < local_43a8.pos)) {
LAB_001436b0:
        dec->header[0] = '\0';
        return 0;
      }
      iVar121 = dec->reserv;
      iVar135 = iVar43;
      if (iVar121 < iVar43) {
        iVar135 = iVar121;
      }
      uVar51 = 0;
      uVar54 = (ulong)(uint)(iVar121 - iVar43);
      if (iVar121 - iVar43 < 1) {
        uVar54 = 0;
      }
      iVar139 = iVar44 + 7;
      if (-1 < iVar44) {
        iVar139 = iVar44;
      }
      memcpy(local_3fa0,dec->reserv_buf + uVar54,(long)iVar135);
      iVar44 = iVar42 + 7;
      if (-1 < iVar42) {
        iVar44 = iVar42;
      }
      memcpy(local_3fa0 + iVar135,local_43a8.buf + (iVar44 >> 3),(long)(iVar139 >> 3));
      local_3fb0.limit = ((iVar139 >> 3) + iVar135) * 8;
      local_3fb0.buf = local_3fa0;
      local_3fb0.pos = 0;
      if (iVar43 <= iVar121) {
        local_4350 = dec->qmf_state;
        uVar54 = (ulong)(uint)local_4380->channels;
        iVar42 = 0;
        uVar49 = CONCAT71((int7)((ulong)local_4380 >> 8),1);
        do {
          local_4354 = (undefined4)uVar49;
          memset(local_3420,0,0x1200);
          local_43c8 = local_34a0 + iVar42 * (int)uVar54;
          local_4360 = (float *)(uVar54 & 0xffffffff);
          local_4340 = uVar54;
          auVar116._0_12_ = ZEXT812(0x3f800000);
          auVar116._12_4_ = 0;
          if (0 < (int)uVar54) {
            local_4390 = (ulong)(uint)local_3fb0.pos;
            uVar54 = 0;
LAB_001438ee:
            __dest = &local_4338;
            local_43b8 = local_43c8 + uVar54;
            uVar5 = local_43c8[uVar54].part_23_length;
            local_43d8 = L3_decode_scalefactors_g_scf_partitions +
                         (((ulong)(local_43c8[uVar54].n_long_sfb == '\0') + 1) -
                         (ulong)(local_43c8[uVar54].n_short_sfb == '\0')) * 0x1c;
            bVar74 = local_43c8[uVar54].scalefac_scale;
            if ((dec->header[1] & 8) == 0) {
              bVar50 = (dec->header[3] & 0x10) >> 4 & uVar54 != 0;
              uVar51 = (uint)(local_43b8->scalefac_compress >> bVar50);
              uVar53 = 0;
              if (bVar50 != 0) {
                uVar53 = 0xc;
              }
              puVar72 = L3_decode_scalefactors_g_mod + uVar53;
              do {
                uVar76 = 1;
                lVar79 = 3;
                do {
                  bVar50 = puVar72[lVar79];
                  local_43cc[lVar79] = (byte)((uVar51 / uVar76) % (ulong)bVar50);
                  uVar75 = (int)uVar76 * (uint)bVar50;
                  uVar76 = (ulong)uVar75;
                  bVar83 = lVar79 != 0;
                  lVar79 = lVar79 + -1;
                } while (bVar83);
                uVar53 = uVar53 + 4;
                puVar72 = puVar72 + 4;
                uVar51 = uVar51 - uVar75;
              } while (-1 < (int)uVar51);
              local_43d8 = local_43d8 + (uVar53 & 0xffffffff);
              uVar51 = 0xfffffff0;
            }
            else {
              uVar51 = (uint)local_43b8->scfsi;
              local_43cc[0] =
                   (byte)L3_decode_scalefactors_g_scfc_decode[local_43b8->scalefac_compress] >> 2;
              local_43cc[1] = local_43cc[0];
              local_43cc[2] =
                   L3_decode_scalefactors_g_scfc_decode[local_43b8->scalefac_compress] & 3;
              local_43cc[3] = local_43cc[2];
            }
            local_4390 = (long)(int)local_4390 + (ulong)uVar5;
            local_4370 = uVar54;
            puVar72 = local_80 + uVar54 * 0x27;
            local_4368 = (uint8_t *)(ulong)bVar74;
            local_43b0 = (float *)CONCAT44(local_43b0._4_4_,bVar74 + 1);
            pbVar65 = (byte *)0x0;
            do {
              uVar54 = (ulong)pbVar65[(long)local_43d8];
              if (uVar54 == 0) break;
              if ((uVar51 & 8) == 0) {
                local_43c0 = pbVar65;
                bVar74 = local_43cc[(long)pbVar65];
                if (bVar74 == 0) {
                  memset(__dest,0,uVar54);
                  memset(puVar72,0,uVar54);
                  pbVar65 = local_43c0;
                }
                else {
                  uVar46 = ~(-1 << (bVar74 & 0x1f));
                  if (-1 < (int)uVar51) {
                    uVar46 = 0xffffffff;
                  }
                  uVar53 = 0;
                  do {
                    uVar45 = get_bits(&local_3fb0,(uint)bVar74);
                    uVar52 = uVar45;
                    if (uVar45 == uVar46) {
                      uVar52 = 0xff;
                    }
                    *(char *)((long)__dest + uVar53) = (char)uVar45;
                    puVar72[uVar53] = (char)uVar52;
                    uVar53 = uVar53 + 1;
                    pbVar65 = local_43c0;
                  } while (uVar54 != uVar53);
                }
              }
              else {
                memcpy(__dest,puVar72,uVar54);
              }
              puVar72 = puVar72 + uVar54;
              __dest = (undefined4 *)((long)__dest + uVar54);
              pbVar65 = pbVar65 + 1;
              uVar51 = uVar51 * 2;
              auVar116._0_12_ = ZEXT812(0x3f800000);
              auVar116._12_4_ = 0;
            } while (pbVar65 != (byte *)0x4);
            *(undefined1 *)((long)__dest + 2) = 0;
            *(undefined2 *)__dest = 0;
            bVar74 = local_43b8->n_short_sfb;
            if ((ulong)bVar74 == 0) {
              if (local_43b8->preflag != '\0') {
                lVar79 = 0;
                do {
                  pcVar1 = (char *)((long)&local_4330 + lVar79 + 3);
                  *pcVar1 = *pcVar1 + (&L3_decode_scalefactors_g_preamp)[lVar79];
                  lVar79 = lVar79 + 1;
                } while (lVar79 != 10);
              }
            }
            else {
              uVar2 = local_43b8->subblock_gain[0];
              bVar50 = 2 - (char)local_4368;
              uVar62 = local_43b8->subblock_gain[1];
              uVar53 = (ulong)local_43b8->n_long_sfb;
              uVar3 = local_43b8->subblock_gain[2];
              uVar54 = 0;
              do {
                pcVar1 = (char *)((long)&local_4338 + uVar54 + uVar53);
                *pcVar1 = *pcVar1 + (uVar2 << (bVar50 & 0x1f));
                pcVar1 = (char *)((long)&local_4338 + uVar54 + uVar53 + 1);
                *pcVar1 = *pcVar1 + (uVar62 << (bVar50 & 0x1f));
                pcVar1 = (char *)((long)&local_4338 + uVar54 + uVar53 + 2);
                *pcVar1 = *pcVar1 + (uVar3 << (bVar50 & 0x1f));
                uVar54 = uVar54 + 3;
              } while (uVar54 < bVar74);
            }
            fVar84 = 2048.0;
            uVar51 = ((uint)((dec->header[3] & 0xe0) == 0x60) * 2 - (uint)local_43b8->global_gain) +
                     0x102;
            do {
              uVar54 = 0x78;
              if (uVar51 < 0x78) {
                uVar54 = (ulong)uVar51;
              }
              uVar78 = (uint)uVar54;
              fVar84 = fVar84 * (float)(int)(0x40000000 >> ((byte)(uVar54 >> 2) & 0x1f)) *
                                (float)(&L3_ldexp_q2_g_expfrac)[uVar78 & 3];
              uVar75 = uVar51 - uVar78;
              bVar83 = (int)uVar78 <= (int)uVar51;
              uVar51 = uVar75;
            } while (uVar75 != 0 && bVar83);
            uVar51 = (uint)bVar74 + (uint)local_43b8->n_long_sfb;
            if (uVar51 != 0) {
              uVar54 = 0;
              do {
                uVar75 = (uint)*(byte *)((long)&local_4338 + uVar54) << ((byte)local_43b0 & 0x1f);
                fVar87 = fVar84;
                do {
                  uVar78 = 0x78;
                  if ((int)uVar75 < 0x78) {
                    uVar78 = uVar75;
                  }
                  fVar87 = fVar87 * (float)(int)(0x40000000 >> ((byte)(uVar78 >> 2) & 0x1f)) *
                                    (float)(&L3_ldexp_q2_g_expfrac)[uVar78 & 3];
                  uVar68 = uVar75 - uVar78;
                  bVar83 = (int)uVar78 <= (int)uVar75;
                  uVar75 = uVar68;
                } while (uVar68 != 0 && bVar83);
                local_2220[uVar54] = fVar87;
                uVar54 = uVar54 + 1;
              } while (uVar54 != uVar51);
            }
            pfVar56 = local_3420 + local_4370 * 0x240;
            uVar51 = local_3fb0.pos + 7;
            if (-1 < local_3fb0.pos) {
              uVar51 = local_3fb0.pos;
            }
            local_4368 = local_3fb0.buf;
            puVar81 = (uint *)((long)(local_3fb0.buf + ((int)uVar51 >> 3)) + 4);
            uVar51 = *(uint *)(local_3fb0.buf + ((int)uVar51 >> 3));
            uVar54 = (ulong)((uVar51 >> 0x18 | (uVar51 & 0xff0000) >> 8 | (uVar51 & 0xff00) << 8 |
                             uVar51 << 0x18) << ((byte)local_3fb0.pos & 7));
            uVar75 = (uint)local_43b8->big_values;
            uVar51 = local_3fb0.pos | 0xfffffff8;
            pbVar65 = local_43b8->sfbtab;
            if (local_43b8->big_values == 0) {
              auVar85._0_12_ = ZEXT812(0);
              auVar85._12_4_ = 0;
              uVar75 = 1;
              local_43f0 = local_2220;
            }
            else {
              lVar79 = 0;
              local_43f0 = local_2220;
              do {
                bVar74 = local_43b8->table_select[lVar79];
                local_43b0 = (float *)lVar79;
                sVar6 = *(short *)(L3_huffman_tabindex + (ulong)bVar74 * 2);
                uVar78 = uVar75;
                uVar68 = (uint)local_43b8->region_count[lVar79];
                if (bVar74 < 0x10) {
                  do {
                    uVar69 = (uint)(*pbVar65 >> 1);
                    uVar75 = uVar69;
                    if (uVar78 < uVar69) {
                      uVar75 = uVar78;
                    }
                    fVar84 = *local_43f0;
                    auVar85 = ZEXT416((uint)fVar84);
                    do {
                      uVar77 = (uint)uVar54;
                      sVar7 = *(short *)(L3_huffman_tabs + (uVar54 >> 0x1b) * 2 + (long)sVar6 * 2);
                      uVar82 = (uint)sVar7;
                      if (sVar7 < 0) {
                        uVar60 = 5;
                        do {
                          uVar77 = (int)uVar54 << (sbyte)uVar60;
                          uVar54 = (ulong)uVar77;
                          uVar51 = uVar51 + uVar60;
                          uVar60 = uVar82 & 7;
                          sVar7 = *(short *)(L3_huffman_tabs +
                                            (ulong)((uVar77 >> (-(char)uVar60 & 0x1fU)) -
                                                   ((int)uVar82 >> 3)) * 2 + (long)sVar6 * 2);
                          uVar82 = (uint)sVar7;
                        } while (sVar7 < 0);
                      }
                      uVar54 = (ulong)(uVar77 << ((byte)(uVar82 >> 8) & 0x1f));
                      uVar51 = (uVar82 >> 8) + uVar51;
                      bVar83 = true;
                      do {
                        bVar58 = bVar83;
                        uVar77 = uVar82 & 0xf;
                        *pfVar56 = g_pow43[((uint)(uVar54 >> 0x1b) & 0x10 | uVar77) ^ 0x10] * fVar84
                        ;
                        uVar54 = (ulong)(uint)((int)uVar54 << (uVar77 != 0));
                        uVar51 = uVar51 + (uVar77 != 0);
                        pfVar56 = pfVar56 + 1;
                        uVar82 = uVar82 >> 4;
                        bVar83 = false;
                      } while (bVar58);
                      uVar77 = uVar51;
                      if (-1 < (int)uVar51) {
                        do {
                          uVar51 = *puVar81;
                          puVar81 = (uint *)((long)puVar81 + 1);
                          uVar54 = (ulong)((uint)uVar54 |
                                          (uint)(byte)uVar51 << ((byte)uVar77 & 0x1f));
                          uVar51 = uVar77 - 8;
                          bVar83 = 7 < uVar77;
                          uVar77 = uVar51;
                        } while (bVar83);
                      }
                      uVar75 = uVar75 - 1;
                    } while (uVar75 != 0);
                    pbVar65 = pbVar65 + 1;
                    local_43f0 = local_43f0 + 1;
                    uVar75 = uVar78 - uVar69;
                  } while ((uVar75 != 0 && (int)uVar69 <= (int)uVar78) &&
                          (bVar83 = 0 < (int)uVar68, uVar78 = uVar75, uVar68 = uVar68 - 1, bVar83));
                }
                else {
                  bVar74 = L3_huffman_g_linbits[bVar74];
                  do {
                    local_43c0 = pbVar65;
                    uVar69 = (uint)(*pbVar65 >> 1);
                    uVar75 = uVar69;
                    if (uVar78 < uVar69) {
                      uVar75 = uVar78;
                    }
                    fVar84 = *local_43f0;
                    auVar85 = ZEXT416((uint)fVar84);
                    do {
                      uVar77 = (uint)uVar54;
                      sVar7 = *(short *)(L3_huffman_tabs + (uVar54 >> 0x1b) * 2 + (long)sVar6 * 2);
                      uVar82 = (uint)sVar7;
                      if (sVar7 < 0) {
                        uVar60 = 5;
                        do {
                          uVar77 = (int)uVar54 << (sbyte)uVar60;
                          uVar54 = (ulong)uVar77;
                          uVar51 = uVar51 + uVar60;
                          uVar60 = uVar82 & 7;
                          sVar7 = *(short *)(L3_huffman_tabs +
                                            (ulong)((uVar77 >> (-(char)uVar60 & 0x1fU)) -
                                                   ((int)uVar82 >> 3)) * 2 + (long)sVar6 * 2);
                          uVar82 = (uint)sVar7;
                        } while (sVar7 < 0);
                      }
                      uVar54 = (ulong)(uVar77 << ((byte)(uVar82 >> 8) & 0x1f));
                      uVar51 = (uVar82 >> 8) + uVar51;
                      bVar83 = true;
                      do {
                        bVar58 = bVar83;
                        uVar77 = uVar82 & 0xf;
                        uVar60 = (uint)uVar54;
                        if (uVar77 == 0xf) {
                          uVar63 = uVar60 >> (0x20 - bVar74 & 0x1f);
                          uVar60 = uVar60 << (bVar74 & 0x1f);
                          uVar51 = uVar51 + bVar74;
                          uVar77 = uVar51;
                          if (-1 < (int)uVar51) {
                            do {
                              uVar51 = *puVar81;
                              puVar81 = (uint *)((long)puVar81 + 1);
                              uVar60 = uVar60 | (uint)(byte)uVar51 << ((byte)uVar77 & 0x1f);
                              uVar51 = uVar77 - 8;
                              bVar83 = 7 < uVar77;
                              uVar77 = uVar51;
                            } while (bVar83);
                          }
                          uVar77 = uVar63 + 0xf;
                          if ((int)uVar77 < 0x81) {
                            fVar87 = g_pow43[(int)(uVar63 + 0x1f)];
                          }
                          else {
                            uVar63 = uVar77 * 8;
                            if (uVar77 >= 0x400) {
                              uVar63 = uVar77;
                            }
                            uVar64 = uVar63 * 2 & 0x40;
                            fVar87 = (float)(int)((uVar63 & 0x3f) - uVar64) /
                                     (float)(int)((uVar63 & 0x7fffffc0) + uVar64);
                            fVar87 = ((fVar87 * 0.22222222 + 1.3333334) * fVar87 + auVar116._0_4_) *
                                     g_pow43[(ulong)(uVar64 + uVar63 >> 6) + 0x10] *
                                     *(float *)(&DAT_001645e0 + (ulong)(uVar77 < 0x400) * 4);
                          }
                          fVar87 = (float)(int)((int)uVar60 >> 0x1f | 1) * fVar87 * fVar84;
                        }
                        else {
                          fVar87 = g_pow43[((uint)(uVar54 >> 0x1b) & 0x10 | uVar77) ^ 0x10] * fVar84
                          ;
                        }
                        uVar54 = (ulong)(uVar60 << (uVar77 != 0));
                        *pfVar56 = fVar87;
                        uVar51 = uVar51 + (uVar77 != 0);
                        pfVar56 = pfVar56 + 1;
                        uVar82 = uVar82 >> 4;
                        bVar83 = false;
                      } while (bVar58);
                      uVar77 = uVar51;
                      if (-1 < (int)uVar51) {
                        do {
                          uVar51 = *puVar81;
                          puVar81 = (uint *)((long)puVar81 + 1);
                          uVar54 = (ulong)((uint)uVar54 |
                                          (uint)(byte)uVar51 << ((byte)uVar77 & 0x1f));
                          uVar51 = uVar77 - 8;
                          bVar83 = 7 < uVar77;
                          uVar77 = uVar51;
                        } while (bVar83);
                      }
                      uVar75 = uVar75 - 1;
                    } while (uVar75 != 0);
                    pbVar65 = pbVar65 + 1;
                    local_43f0 = local_43f0 + 1;
                    uVar75 = uVar78 - uVar69;
                  } while ((uVar75 != 0 && (int)uVar69 <= (int)uVar78) &&
                          (bVar83 = 0 < (int)uVar68, uVar78 = uVar75, uVar68 = uVar68 - 1, bVar83));
                }
                lVar79 = lVar79 + 1;
              } while (0 < (int)uVar75);
              uVar75 = 1 - uVar75;
            }
            puVar72 = L3_huffman_tab33;
            if (local_43b8->count1_table == '\0') {
              puVar72 = L3_huffman_tab32;
            }
            do {
              bVar74 = puVar72[uVar54 >> 0x1c];
              if ((bVar74 & 8) == 0) {
                bVar74 = puVar72[(ulong)((uint)((int)uVar54 << 4) >> (-(bVar74 & 3) & 0x1f)) +
                                 (ulong)(bVar74 >> 3)];
              }
              uVar68 = bVar74 & 7;
              uVar78 = (int)uVar54 << (sbyte)uVar68;
              uVar51 = uVar68 + uVar51;
              if ((long)local_4390 <
                  (long)(int)uVar51 + ((long)puVar81 - (long)local_3fb0.buf) * 8 + -0x18)
              goto LAB_0014422d;
              uVar75 = uVar75 - 1;
              if (uVar75 == 0) {
                bVar50 = *pbVar65;
                if (bVar50 < 2) goto LAB_0014422d;
                pbVar65 = pbVar65 + 1;
                uVar75 = (uint)(bVar50 >> 1);
                auVar85 = ZEXT416((uint)*local_43f0);
                local_43f0 = local_43f0 + 1;
              }
              if (0x7f < bVar74) {
                auVar89 = auVar85;
                if ((int)uVar78 < 0) {
                  auVar89._0_4_ = auVar85._0_4_ ^ 0x80000000;
                  auVar89._4_4_ = 0;
                  auVar89._8_4_ = auVar85._8_4_ ^ 0x80000000;
                  auVar89._12_4_ = auVar85._12_4_ ^ 0x80000000;
                }
                *pfVar56 = auVar89._0_4_;
                uVar78 = uVar78 * 2;
                uVar51 = uVar51 + 1;
              }
              if ((bVar74 & 0x40) != 0) {
                auVar90 = auVar85;
                if ((int)uVar78 < 0) {
                  auVar90._0_4_ = auVar85._0_4_ ^ 0x80000000;
                  auVar90._4_4_ = 0;
                  auVar90._8_4_ = auVar85._8_4_ ^ 0x80000000;
                  auVar90._12_4_ = auVar85._12_4_ ^ 0x80000000;
                }
                pfVar56[1] = auVar90._0_4_;
                uVar78 = uVar78 * 2;
                uVar51 = uVar51 + 1;
              }
              uVar75 = uVar75 - 1;
              if (uVar75 == 0) {
                bVar50 = *pbVar65;
                if (bVar50 < 2) goto LAB_0014422d;
                pbVar65 = pbVar65 + 1;
                uVar75 = (uint)(bVar50 >> 1);
                auVar85 = ZEXT416((uint)*local_43f0);
                local_43f0 = local_43f0 + 1;
              }
              if ((bVar74 & 0x20) != 0) {
                auVar91 = auVar85;
                if ((int)uVar78 < 0) {
                  auVar91._0_4_ = auVar85._0_4_ ^ 0x80000000;
                  auVar91._4_4_ = 0;
                  auVar91._8_4_ = auVar85._8_4_ ^ 0x80000000;
                  auVar91._12_4_ = auVar85._12_4_ ^ 0x80000000;
                }
                pfVar56[2] = auVar91._0_4_;
                uVar78 = uVar78 * 2;
                uVar51 = uVar51 + 1;
              }
              if ((bVar74 & 0x10) != 0) {
                auVar92 = auVar85;
                if ((int)uVar78 < 0) {
                  auVar92._0_4_ = auVar85._0_4_ ^ 0x80000000;
                  auVar92._4_4_ = 0;
                  auVar92._8_4_ = auVar85._8_4_ ^ 0x80000000;
                  auVar92._12_4_ = auVar85._12_4_ ^ 0x80000000;
                }
                pfVar56[3] = auVar92._0_4_;
                uVar78 = uVar78 * 2;
                uVar51 = uVar51 + 1;
              }
              uVar54 = (ulong)uVar78;
              puVar47 = puVar81;
              if (-1 < (int)uVar51) {
                puVar47 = (uint *)((long)puVar81 + (ulong)(uVar51 >> 3) + 1);
                uVar78 = uVar51;
                do {
                  uVar68 = *puVar81;
                  puVar81 = (uint *)((long)puVar81 + 1);
                  uVar54 = (ulong)((uint)uVar54 | (uint)(byte)uVar68 << ((byte)uVar78 & 0x1f));
                  bVar83 = 7 < uVar78;
                  uVar78 = uVar78 - 8;
                } while (bVar83);
                uVar51 = (uVar51 & 0x80000007) - 8;
              }
              pfVar56 = pfVar56 + 4;
              puVar81 = puVar47;
            } while( true );
          }
LAB_00144252:
          bVar74 = dec->header[3];
          if ((bVar74 & 0x10) == 0) {
            if ((bVar74 & 0xe0) == 0x60) {
              uVar54 = 0xfffffffffffffffc;
              do {
                fVar84 = afStack_3410[uVar54];
                fVar87 = afStack_3410[uVar54 + 1];
                fVar88 = afStack_3410[uVar54 + 2];
                fVar30 = afStack_3410[uVar54 + 3];
                auVar86 = *(undefined1 (*) [16])(afStack_2b10 + uVar54);
                auVar105._0_4_ = fVar84 + auVar86._0_4_;
                auVar105._4_4_ = fVar87 + auVar86._4_4_;
                auVar105._8_4_ = fVar88 + auVar86._8_4_;
                auVar105._12_4_ = fVar30 + auVar86._12_4_;
                *(undefined1 (*) [16])(afStack_3410 + uVar54) = auVar105;
                afStack_2b10[uVar54] = fVar84 - auVar86._0_4_;
                afStack_2b10[uVar54 + 1] = fVar87 - auVar86._4_4_;
                afStack_2b10[uVar54 + 2] = fVar88 - auVar86._8_4_;
                local_2220[uVar54 - 0x239] = fVar30 - auVar86._12_4_;
                uVar54 = uVar54 + 4;
              } while (uVar54 < 0x239);
            }
          }
          else {
            bVar50 = local_43c8->n_long_sfb;
            bVar59 = local_43c8->n_short_sfb;
            puVar48 = local_43c8->sfbtab;
            local_4330 = -NAN;
            _local_4338 = 0xffffffffffffffff;
            uVar51 = (uint)bVar59 + (uint)bVar50;
            if (uVar51 != 0) {
              uVar54 = 0;
              puVar72 = local_2b20;
              do {
                uVar53 = (ulong)puVar48[uVar54];
                if (uVar53 == 0) {
                  uVar53 = 0;
                }
                else {
                  uVar76 = 0;
                  do {
                    if (((*(float *)(puVar72 + uVar76 * 4) != 0.0) ||
                        (*(float *)(puVar72 + uVar76 * 4 + 4) != 0.0)) ||
                       (NAN(*(float *)(puVar72 + uVar76 * 4 + 4)))) {
                      (&local_4338)[(uint)((int)uVar54 + (int)((uVar54 & 0xffffffff) / 3) * -3)] =
                           (int)uVar54;
                      break;
                    }
                    uVar76 = uVar76 + 2;
                  } while (uVar76 < uVar53);
                }
                puVar72 = puVar72 + uVar53 * 4;
                uVar54 = uVar54 + 1;
              } while (uVar54 != uVar51);
            }
            if (bVar50 != 0) {
              if ((int)fStack_4334 < (int)local_4338) {
                fStack_4334 = local_4338;
              }
              if ((int)fStack_4334 <= (int)local_4330) {
                fStack_4334 = local_4330;
              }
              local_4330 = fStack_4334;
              _local_4338 = CONCAT44(fStack_4334,fStack_4334);
            }
            uVar75 = (uint)(bVar59 != 0) * 2 + 1;
            lVar79 = (long)(int)(uVar51 - uVar75) + -0x59;
            uVar54 = 0;
            do {
              if ((int)(&local_4338)[uVar54] < (int)(uVar51 + uVar75 * -2 + (int)uVar54)) {
                bVar50 = local_59[uVar54 + (lVar79 - (ulong)uVar75) + 0x59];
              }
              else {
                bVar50 = (char)(dec->header[1] << 4) >> 7 & 3;
              }
              local_59[uVar54 + lVar79 + 0x59] = bVar50;
              uVar54 = uVar54 + 1;
            } while (uVar54 != uVar75);
            pbVar65 = local_43c8->sfbtab;
            bVar50 = dec->header[1];
            bVar59 = 7;
            if ((bVar50 & 8) == 0) {
              bVar59 = 0x40;
            }
            bVar80 = *pbVar65;
            if (bVar80 != 0) {
              uVar8 = local_43c8[1].scalefac_compress;
              fVar84 = *(float *)(&DAT_001645e8 + (ulong)((bVar74 & 0x20) == 0) * 4);
              uVar54 = 0;
              pfVar56 = local_3420;
              do {
                iVar42 = (int)uVar54;
                if ((int)(&local_4338)[(uint)(iVar42 + (int)(uVar54 / 3) * -3)] < iVar42) {
                  bVar4 = local_59[uVar54];
                  if (bVar59 <= bVar4) goto LAB_00144502;
                  if ((bVar50 & 8) == 0) {
                    auVar93 = auVar116;
                    uVar51 = (bVar4 + 1 >> 1) << ((byte)uVar8 & 1);
                    do {
                      auVar86 = auVar93;
                      uVar75 = 0x78;
                      if ((int)uVar51 < 0x78) {
                        uVar75 = uVar51;
                      }
                      auVar93._4_12_ = auVar86._4_12_;
                      auVar93._0_4_ =
                           auVar86._0_4_ *
                           (float)(int)(0x40000000 >> ((byte)(uVar75 >> 2) & 0x1f)) *
                           (float)(&L3_ldexp_q2_g_expfrac)[uVar75 & 3];
                      uVar78 = uVar51 - uVar75;
                      bVar83 = (int)uVar75 <= (int)uVar51;
                      uVar51 = uVar78;
                    } while (uVar78 != 0 && bVar83);
                    auVar106 = auVar116;
                    if ((bVar4 & 1) != 0) {
                      auVar106._4_4_ = 0;
                      auVar106._0_4_ = auVar93._0_4_;
                      auVar106._8_4_ = auVar86._8_4_;
                      auVar106._12_4_ = auVar86._12_4_;
                      auVar93 = auVar116;
                    }
                    fVar88 = auVar93._0_4_;
                    fVar87 = auVar106._0_4_;
                  }
                  else {
                    fVar87 = *(float *)(L3_stereo_process_g_pan + (ulong)bVar4 * 8);
                    fVar88 = *(float *)(L3_stereo_process_g_pan + (ulong)bVar4 * 8 + 4);
                  }
                  uVar53 = 0;
                  do {
                    pfVar56[uVar53 + 0x240] = fVar88 * fVar84 * pfVar56[uVar53];
                    pfVar56[uVar53] = pfVar56[uVar53] * fVar87 * fVar84;
                    uVar53 = uVar53 + 1;
                  } while (bVar80 != uVar53);
                }
                else {
LAB_00144502:
                  if ((bVar74 & 0x20) != 0) {
                    if (bVar80 < 4) {
                      uVar53 = 0;
                    }
                    else {
                      uVar53 = 0;
                      do {
                        pfVar71 = pfVar56 + uVar53;
                        fVar87 = *pfVar71;
                        fVar88 = pfVar71[1];
                        fVar30 = pfVar71[2];
                        fVar31 = pfVar71[3];
                        auVar86 = *(undefined1 (*) [16])(pfVar56 + uVar53 + 0x240);
                        pfVar71 = pfVar56 + uVar53;
                        *pfVar71 = fVar87 + auVar86._0_4_;
                        pfVar71[1] = fVar88 + auVar86._4_4_;
                        pfVar71[2] = fVar30 + auVar86._8_4_;
                        pfVar71[3] = fVar31 + auVar86._12_4_;
                        auVar94._0_4_ = fVar87 - auVar86._0_4_;
                        auVar94._4_4_ = fVar88 - auVar86._4_4_;
                        auVar94._8_4_ = fVar30 - auVar86._8_4_;
                        auVar94._12_4_ = fVar31 - auVar86._12_4_;
                        *(undefined1 (*) [16])(pfVar56 + uVar53 + 0x240) = auVar94;
                        uVar53 = uVar53 + 4;
                      } while (uVar53 < bVar80 - 3);
                      if ((int)(uint)bVar80 <= (int)uVar53) goto LAB_001445ff;
                    }
                    uVar53 = uVar53 & 0xffffffff;
                    do {
                      fVar87 = pfVar56[uVar53];
                      pfVar56[uVar53] = fVar87 + pfVar56[uVar53 + 0x240];
                      pfVar56[uVar53 + 0x240] = fVar87 - pfVar56[uVar53 + 0x240];
                      uVar53 = uVar53 + 1;
                    } while (bVar80 != uVar53);
                  }
                }
LAB_001445ff:
                pfVar56 = pfVar56 + pbVar65[uVar54];
                uVar54 = (ulong)(iVar42 + 1);
                bVar80 = pbVar65[uVar54];
              } while (bVar80 != 0);
            }
          }
          if (0 < (int)local_4340) {
            uVar54 = 0;
            pLVar66 = local_43c8;
            do {
              uVar2 = pLVar66->mixed_block_flag;
              iVar42 = (uint)(uVar2 != '\0') * 2 <<
                       ((byte)(((dec->header[1] >> 3 & 1) + ((dec->header[1] >> 4 & 1) != 0)) *
                               '\x03' + (dec->header[2] >> 2 & 3)) == '\x02');
              local_43c8 = pLVar66;
              if (pLVar66->n_short_sfb == '\0') {
                pfVar56 = local_3420 + uVar54 * 0x240;
                iVar44 = 0x1f;
                pfVar71 = pfVar56;
LAB_0014475e:
                do {
                  lVar79 = 0;
                  bVar83 = true;
                  do {
                    bVar58 = bVar83;
                    pfVar61 = pfVar56 + lVar79 + 0x12;
                    fVar84 = *pfVar61;
                    fVar87 = pfVar61[1];
                    fVar88 = pfVar61[2];
                    fVar30 = pfVar61[3];
                    fVar31 = pfVar56[0xe - lVar79];
                    fVar32 = pfVar56[0xf - lVar79];
                    fVar33 = pfVar56[0x10 - lVar79];
                    fVar34 = pfVar56[0x11 - lVar79];
                    auVar86 = *(undefined1 (*) [16])(L3_antialias_g_aa + lVar79 * 4);
                    lVar57 = lVar79 * 4;
                    fVar35 = *(float *)(L3_antialias_g_aa + lVar57 + 0x20);
                    fVar36 = *(float *)(L3_antialias_g_aa + lVar57 + 0x24);
                    fVar37 = *(float *)(L3_antialias_g_aa + lVar57 + 0x28);
                    fVar38 = *(float *)(L3_antialias_g_aa + lVar57 + 0x2c);
                    pfVar61 = pfVar56 + lVar79 + 0x12;
                    *pfVar61 = fVar84 * auVar86._0_4_ - fVar34 * fVar35;
                    pfVar61[1] = fVar87 * auVar86._4_4_ - fVar33 * fVar36;
                    pfVar61[2] = fVar88 * auVar86._8_4_ - fVar32 * fVar37;
                    pfVar61[3] = fVar30 * auVar86._12_4_ - fVar31 * fVar38;
                    auVar95._4_4_ = fVar32 * auVar86._8_4_ + fVar88 * fVar37;
                    auVar95._0_4_ = fVar31 * auVar86._12_4_ + fVar30 * fVar38;
                    auVar95._8_4_ = fVar33 * auVar86._4_4_ + fVar87 * fVar36;
                    auVar95._12_4_ = fVar34 * auVar86._0_4_ + fVar84 * fVar35;
                    *(undefined1 (*) [16])(pfVar56 + (0xe - lVar79)) = auVar95;
                    lVar79 = 4;
                    bVar83 = false;
                  } while (bVar58);
                  bVar83 = 1 < iVar44;
                  pfVar56 = pfVar56 + 0x12;
                  iVar44 = iVar44 + -1;
                } while (bVar83);
                overlap = dec->mdct_overlap + uVar54;
                uVar62 = pLVar66->block_type;
                pfVar56 = pfVar71;
                if (uVar2 != '\0') {
                  L3_imdct36(pfVar71,*overlap,(float *)L3_imdct_gr_g_mdct_window,iVar42);
                  overlap = (float (*) [288])((long)*overlap + (ulong)(uint)(iVar42 * 0x24));
                  pfVar56 = (float *)((long)local_3420 +
                                     (ulong)(uint)(iVar42 * 0x48) + uVar54 * 0x900);
                }
              }
              else {
                pfVar56 = local_3420 + uVar54 * 0x240;
                pfVar71 = (float *)((ulong)(uint)(iVar42 * 0x48) + (long)pfVar56);
                bVar74 = pLVar66->sfbtab[pLVar66->n_long_sfb];
                if (bVar74 == 0) {
                  pfVar61 = local_2180;
                }
                else {
                  puVar48 = pLVar66->sfbtab + pLVar66->n_long_sfb;
                  pfVar55 = local_2180;
                  pfVar70 = pfVar71;
                  do {
                    pfVar73 = pfVar70 + (ulong)bVar74 * 2;
                    lVar79 = 0;
                    pfVar61 = pfVar55;
                    do {
                      *pfVar55 = pfVar70[lVar79];
                      pfVar55[1] = pfVar70[(ulong)bVar74 + lVar79];
                      pfVar55[2] = *pfVar73;
                      pfVar55 = pfVar55 + 3;
                      pfVar61 = pfVar61 + 3;
                      pfVar73 = pfVar73 + 1;
                      lVar79 = lVar79 + 1;
                    } while ((uint)bVar74 != (uint)lVar79);
                    bVar74 = puVar48[3];
                    puVar48 = puVar48 + 3;
                    pfVar70 = pfVar73;
                  } while (bVar74 != 0);
                }
                memcpy(pfVar71,local_2180,(long)pfVar61 - (long)local_2180);
                pfVar71 = pfVar56;
                if (uVar2 != '\0') {
                  iVar44 = iVar42 + -1;
                  goto LAB_0014475e;
                }
                overlap = dec->mdct_overlap + uVar54;
                uVar62 = pLVar66->block_type;
              }
              if (uVar62 == '\x02') {
                uVar51 = 0x21 - iVar42;
                lVar79 = 0;
                do {
                  pfVar61 = (float *)((long)pfVar56 + lVar79 * 2);
                  pfVar55 = pfVar61;
                  pfVar70 = (float *)&local_4338;
                  for (lVar57 = 0x12; lVar57 != 0; lVar57 = lVar57 + -1) {
                    *pfVar70 = *pfVar55;
                    pfVar55 = pfVar55 + (ulong)bVar41 * -2 + 1;
                    pfVar70 = pfVar70 + (ulong)bVar41 * -2 + 1;
                  }
                  pfVar55 = (float *)((long)*overlap + lVar79 + 0x18);
                  *(undefined8 *)(pfVar61 + 4) = *(undefined8 *)(pfVar55 + -2);
                  uVar49 = *(undefined8 *)(pfVar55 + -4);
                  *(undefined8 *)pfVar61 = *(undefined8 *)(pfVar55 + -6);
                  *(undefined8 *)(pfVar61 + 2) = uVar49;
                  L3_imdct12((float *)&local_4338,(float *)((long)pfVar56 + lVar79 * 2 + 0x18),
                             pfVar55);
                  L3_imdct12(&fStack_4334,(float *)((long)pfVar56 + lVar79 * 2 + 0x30),pfVar55);
                  L3_imdct12((float *)&local_4330,(float *)((long)*overlap + lVar79),pfVar55);
                  uVar51 = uVar51 - 1;
                  lVar79 = lVar79 + 0x24;
                } while (1 < uVar51);
              }
              else {
                L3_imdct36(pfVar56,*overlap,
                           (float *)(L3_imdct_gr_g_mdct_window + (ulong)(uVar62 == '\x03') * 0x48),
                           0x20 - iVar42);
              }
              pfVar71 = pfVar71 + 0x13;
              uVar51 = 0;
              do {
                uVar53 = 0xffffffffffffffff;
                do {
                  pfVar71[uVar53 + 1] = (float)((uint)pfVar71[uVar53 + 1] ^ (uint)DAT_0015b090);
                  uVar53 = uVar53 + 2;
                } while (uVar53 < 0x10);
                pfVar71 = pfVar71 + 0x24;
                bVar83 = uVar51 < 0x1e;
                uVar51 = uVar51 + 2;
              } while (bVar83);
              uVar54 = uVar54 + 1;
              pLVar66 = local_43c8 + 1;
            } while ((float *)uVar54 != local_4360);
          }
          pmVar40 = local_4378;
          pmVar39 = local_4380;
          mp3d_synth_granule(local_4350,local_3420,0x12,local_4380->channels,local_4378,local_2180);
          uVar54 = (ulong)pmVar39->channels;
          local_4378 = pmVar40 + uVar54 * 0x240;
          iVar42 = 1;
          uVar49 = 0;
        } while (((byte)local_4354 & (local_4348[1] & 8) >> 3) != 0);
        uVar51 = local_3fb0.pos + 7U >> 3;
      }
      uVar78 = ((uint)local_3fb0.limit >> 3) - uVar51;
      uVar75 = 0x1ff;
      if ((int)uVar78 < 0x1ff) {
        uVar75 = uVar78;
      }
      if (0 < (int)uVar78) {
        if (0x1ff < uVar78) {
          uVar51 = ((uint)local_3fb0.limit >> 3) - 0x1ff;
        }
        memcpy(dec->reserv_buf,local_3fa0 + uVar51,(ulong)uVar75);
      }
      uVar51 = (uint)(iVar43 <= iVar121);
      dec->reserv = uVar75;
    }
    else {
      bVar41 = puVar48[3] >> 6;
      if (bVar41 == 3) {
        uVar51 = 0;
      }
      else if (bVar41 == 1) {
        uVar51 = (puVar48[3] >> 2 & 0xc) + 4;
      }
      else {
        uVar51 = 0x20;
      }
      if ((~bVar74 & 6) == 0) {
        puVar72 = &L12_subband_alloc_table_g_alloc_L1;
        uVar78 = 0x20;
      }
      else if ((bVar74 & 8) == 0) {
        puVar72 = &L12_subband_alloc_table_g_alloc_L2M2;
        uVar78 = 0x1e;
      }
      else {
        bVar59 = puVar48[2] >> 2 & 3;
        bVar50 = *(byte *)((ulong)(puVar48[2] >> 4) +
                          (long)(int)((bVar74 >> 1 & 3) - 1) * 0xf + 0x16463d);
        uVar75 = 0xc0;
        if (bVar50 != 0) {
          uVar75 = (uint)bVar50 + (uint)bVar50 >> (bVar41 != 3);
        }
        if (uVar75 < 0x38) {
          uVar78 = (uint)(bVar59 == 2) * 4 + 8;
          puVar72 = (undefined1 *)&L12_subband_alloc_table_g_alloc_L2M1_lowrate;
        }
        else {
          uVar78 = 0x1b;
          if (bVar59 != 1) {
            uVar78 = (uint)(0x5f < uVar75) * 3 + 0x1b;
          }
          puVar72 = L12_subband_alloc_table_g_alloc_L2M1;
        }
      }
      local_43e8 = local_4036;
      local_4038 = (byte)uVar78;
      local_43c0 = (byte *)(ulong)uVar78;
      if (uVar51 < uVar78) {
        uVar78 = uVar51;
      }
      uVar54 = (ulong)uVar78;
      local_4037 = (byte)uVar78;
      uVar53 = 0;
      puVar67 = L12_read_scale_info_g_bitalloc_code_tab;
      uVar75 = 0;
      uVar76 = 0;
      do {
        if (uVar53 == uVar76) {
          uVar76 = (ulong)((int)uVar76 + (uint)(byte)puVar72[2]);
          uVar75 = (uint)(byte)puVar72[1];
          puVar67 = L12_read_scale_info_g_bitalloc_code_tab + (byte)*puVar72;
          puVar72 = puVar72 + 3;
        }
        uVar46 = get_bits(&local_43a8,uVar75);
        bVar41 = puVar67[uVar46];
        local_4036[uVar53 * 2] = bVar41;
        if (uVar53 < uVar54) {
          uVar46 = get_bits(&local_43a8,uVar75);
          bVar41 = puVar67[uVar46];
        }
        if (uVar51 == 0) {
          bVar41 = 0;
        }
        local_4036[uVar53 * 2 + 1] = bVar41;
        uVar53 = uVar53 + 1;
      } while (local_43c0 != (byte *)uVar53);
      uVar53 = (ulong)(uint)((int)local_43c0 * 2);
      uVar76 = 0;
      do {
        bVar41 = (local_4036[uVar76] == 0) << 2 | 2;
        if ((local_4036[uVar76] != 0) && ((bVar74 & 6) != 6)) {
          uVar46 = get_bits(&local_43a8,2);
          bVar41 = (byte)uVar46;
        }
        abStack_3ff6[uVar76] = bVar41;
        uVar76 = uVar76 + 1;
      } while (uVar53 != uVar76);
      local_43b0 = (float *)CONCAT44(local_43b0._4_4_,uVar51);
      pfVar56 = (float *)&local_4338;
      uVar76 = 0;
      do {
        bVar41 = *local_43e8;
        uVar51 = 0;
        if (bVar41 != 0) {
          uVar51 = 0x13U >> (abStack_3ff6[uVar76] & 0x1f) | 4;
        }
        local_43e8 = local_43e8 + 1;
        fVar84 = 0.0;
        uVar75 = 4;
        do {
          if ((uVar75 & uVar51) != 0) {
            uVar46 = get_bits(&local_43a8,6);
            fVar84 = (float)(int)(0x200000 >> ((byte)((int)uVar46 / 3) & 0x1f)) *
                     *(float *)(L12_read_scalefactors_g_deq_L12 +
                               (long)(int)((int)uVar46 % 3 + (uint)bVar41 + (uint)bVar41 * 2 + -6) *
                               4);
          }
          *pfVar56 = fVar84;
          pfVar56 = pfVar56 + 1;
          bVar83 = 1 < uVar75;
          uVar75 = uVar75 >> 1;
        } while (bVar83);
        uVar76 = uVar76 + 1;
      } while (uVar76 != uVar53);
      if ((uint)local_43b0 < (uint)local_43c0) {
        lVar79 = ((long)local_43c0 - uVar54) + -1;
        auVar86._8_4_ = (int)lVar79;
        auVar86._0_8_ = lVar79;
        auVar86._12_4_ = (int)((ulong)lVar79 >> 0x20);
        lVar79 = uVar54 * 2;
        uVar53 = 0;
        do {
          auVar117._8_4_ = (int)uVar53;
          auVar117._0_8_ = uVar53;
          auVar117._12_4_ = (int)(uVar53 >> 0x20);
          auVar119 = auVar86 ^ _DAT_0015b090;
          auVar122 = (auVar117 | _DAT_0015b0b0) ^ _DAT_0015b090;
          iVar42 = auVar119._0_4_;
          iVar135 = -(uint)(iVar42 < auVar122._0_4_);
          iVar43 = auVar119._4_4_;
          auVar124._4_4_ = -(uint)(iVar43 < auVar122._4_4_);
          iVar44 = auVar119._8_4_;
          iVar139 = -(uint)(iVar44 < auVar122._8_4_);
          iVar121 = auVar119._12_4_;
          auVar124._12_4_ = -(uint)(iVar121 < auVar122._12_4_);
          auVar96._4_4_ = iVar135;
          auVar96._0_4_ = iVar135;
          auVar96._8_4_ = iVar139;
          auVar96._12_4_ = iVar139;
          auVar96 = pshuflw(in_XMM1,auVar96,0xe8);
          auVar123._4_4_ = -(uint)(auVar122._4_4_ == iVar43);
          auVar123._12_4_ = -(uint)(auVar122._12_4_ == iVar121);
          auVar123._0_4_ = auVar123._4_4_;
          auVar123._8_4_ = auVar123._12_4_;
          auVar107 = pshuflw(in_XMM2,auVar123,0xe8);
          auVar124._0_4_ = auVar124._4_4_;
          auVar124._8_4_ = auVar124._12_4_;
          auVar122 = pshuflw(auVar96,auVar124,0xe8);
          auVar119._8_4_ = 0xffffffff;
          auVar119._0_8_ = 0xffffffffffffffff;
          auVar119._12_4_ = 0xffffffff;
          auVar119 = (auVar122 | auVar107 & auVar96) ^ auVar119;
          auVar119 = packssdw(auVar119,auVar119);
          if ((auVar119 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_4036[uVar53 * 2 + lVar79 + 1] = 0;
          }
          auVar107._4_4_ = iVar135;
          auVar107._0_4_ = iVar135;
          auVar107._8_4_ = iVar139;
          auVar107._12_4_ = iVar139;
          auVar124 = auVar123 & auVar107 | auVar124;
          auVar119 = packssdw(auVar124,auVar124);
          auVar122._8_4_ = 0xffffffff;
          auVar122._0_8_ = 0xffffffffffffffff;
          auVar122._12_4_ = 0xffffffff;
          auVar119 = packssdw(auVar119 ^ auVar122,auVar119 ^ auVar122);
          auVar119 = packsswb(auVar119,auVar119);
          if ((auVar119._0_4_ >> 8 & 1) != 0) {
            local_4036[uVar53 * 2 + lVar79 + 3] = 0;
          }
          auVar119 = (auVar117 | _DAT_0015b0d0) ^ _DAT_0015b090;
          auVar108._0_4_ = -(uint)(iVar42 < auVar119._0_4_);
          auVar108._4_4_ = -(uint)(iVar43 < auVar119._4_4_);
          auVar108._8_4_ = -(uint)(iVar44 < auVar119._8_4_);
          auVar108._12_4_ = -(uint)(iVar121 < auVar119._12_4_);
          auVar125._4_4_ = auVar108._0_4_;
          auVar125._0_4_ = auVar108._0_4_;
          auVar125._8_4_ = auVar108._8_4_;
          auVar125._12_4_ = auVar108._8_4_;
          iVar135 = -(uint)(auVar119._4_4_ == iVar43);
          iVar139 = -(uint)(auVar119._12_4_ == iVar121);
          auVar18._4_4_ = iVar135;
          auVar18._0_4_ = iVar135;
          auVar18._8_4_ = iVar139;
          auVar18._12_4_ = iVar139;
          auVar136._4_4_ = auVar108._4_4_;
          auVar136._0_4_ = auVar108._4_4_;
          auVar136._8_4_ = auVar108._12_4_;
          auVar136._12_4_ = auVar108._12_4_;
          auVar119 = auVar18 & auVar125 | auVar136;
          auVar119 = packssdw(auVar119,auVar119);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar119 = packssdw(auVar119 ^ auVar9,auVar119 ^ auVar9);
          auVar119 = packsswb(auVar119,auVar119);
          if ((auVar119._0_4_ >> 0x10 & 1) != 0) {
            local_4036[uVar53 * 2 + lVar79 + 5] = 0;
          }
          auVar119 = pshufhw(auVar119,auVar125,0x84);
          auVar19._4_4_ = iVar135;
          auVar19._0_4_ = iVar135;
          auVar19._8_4_ = iVar139;
          auVar19._12_4_ = iVar139;
          auVar122 = pshufhw(auVar108,auVar19,0x84);
          auVar96 = pshufhw(auVar119,auVar136,0x84);
          auVar97._8_4_ = 0xffffffff;
          auVar97._0_8_ = 0xffffffffffffffff;
          auVar97._12_4_ = 0xffffffff;
          auVar97 = (auVar96 | auVar122 & auVar119) ^ auVar97;
          auVar119 = packssdw(auVar97,auVar97);
          auVar119 = packsswb(auVar119,auVar119);
          if ((auVar119._0_4_ >> 0x18 & 1) != 0) {
            local_4036[uVar53 * 2 + lVar79 + 7] = 0;
          }
          auVar119 = (auVar117 | _DAT_0015fce0) ^ _DAT_0015b090;
          auVar109._0_4_ = -(uint)(iVar42 < auVar119._0_4_);
          auVar109._4_4_ = -(uint)(iVar43 < auVar119._4_4_);
          auVar109._8_4_ = -(uint)(iVar44 < auVar119._8_4_);
          auVar109._12_4_ = -(uint)(iVar121 < auVar119._12_4_);
          auVar20._4_4_ = auVar109._0_4_;
          auVar20._0_4_ = auVar109._0_4_;
          auVar20._8_4_ = auVar109._8_4_;
          auVar20._12_4_ = auVar109._8_4_;
          auVar122 = pshuflw(auVar136,auVar20,0xe8);
          auVar98._0_4_ = -(uint)(auVar119._0_4_ == iVar42);
          auVar98._4_4_ = -(uint)(auVar119._4_4_ == iVar43);
          auVar98._8_4_ = -(uint)(auVar119._8_4_ == iVar44);
          auVar98._12_4_ = -(uint)(auVar119._12_4_ == iVar121);
          auVar126._4_4_ = auVar98._4_4_;
          auVar126._0_4_ = auVar98._4_4_;
          auVar126._8_4_ = auVar98._12_4_;
          auVar126._12_4_ = auVar98._12_4_;
          auVar119 = pshuflw(auVar98,auVar126,0xe8);
          auVar127._4_4_ = auVar109._4_4_;
          auVar127._0_4_ = auVar109._4_4_;
          auVar127._8_4_ = auVar109._12_4_;
          auVar127._12_4_ = auVar109._12_4_;
          auVar96 = pshuflw(auVar109,auVar127,0xe8);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar119 = packssdw(auVar119 & auVar122,(auVar96 | auVar119 & auVar122) ^ auVar10);
          auVar119 = packsswb(auVar119,auVar119);
          if ((auVar119 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_4036[uVar53 * 2 + lVar79 + 9] = 0;
          }
          auVar21._4_4_ = auVar109._0_4_;
          auVar21._0_4_ = auVar109._0_4_;
          auVar21._8_4_ = auVar109._8_4_;
          auVar21._12_4_ = auVar109._8_4_;
          auVar127 = auVar126 & auVar21 | auVar127;
          auVar96 = packssdw(auVar127,auVar127);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar119 = packssdw(auVar119,auVar96 ^ auVar11);
          auVar119 = packsswb(auVar119,auVar119);
          if ((auVar119._4_2_ >> 8 & 1) != 0) {
            local_4036[uVar53 * 2 + lVar79 + 0xb] = 0;
          }
          auVar119 = (auVar117 | _DAT_0015fcd0) ^ _DAT_0015b090;
          auVar110._0_4_ = -(uint)(iVar42 < auVar119._0_4_);
          auVar110._4_4_ = -(uint)(iVar43 < auVar119._4_4_);
          auVar110._8_4_ = -(uint)(iVar44 < auVar119._8_4_);
          auVar110._12_4_ = -(uint)(iVar121 < auVar119._12_4_);
          auVar128._4_4_ = auVar110._0_4_;
          auVar128._0_4_ = auVar110._0_4_;
          auVar128._8_4_ = auVar110._8_4_;
          auVar128._12_4_ = auVar110._8_4_;
          iVar135 = -(uint)(auVar119._4_4_ == iVar43);
          iVar139 = -(uint)(auVar119._12_4_ == iVar121);
          auVar22._4_4_ = iVar135;
          auVar22._0_4_ = iVar135;
          auVar22._8_4_ = iVar139;
          auVar22._12_4_ = iVar139;
          auVar137._4_4_ = auVar110._4_4_;
          auVar137._0_4_ = auVar110._4_4_;
          auVar137._8_4_ = auVar110._12_4_;
          auVar137._12_4_ = auVar110._12_4_;
          auVar119 = auVar22 & auVar128 | auVar137;
          auVar119 = packssdw(auVar119,auVar119);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar119 = packssdw(auVar119 ^ auVar12,auVar119 ^ auVar12);
          auVar119 = packsswb(auVar119,auVar119);
          if ((auVar119 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_4036[uVar53 * 2 + lVar79 + 0xd] = 0;
          }
          auVar119 = pshufhw(auVar119,auVar128,0x84);
          auVar23._4_4_ = iVar135;
          auVar23._0_4_ = iVar135;
          auVar23._8_4_ = iVar139;
          auVar23._12_4_ = iVar139;
          auVar122 = pshufhw(auVar110,auVar23,0x84);
          auVar96 = pshufhw(auVar119,auVar137,0x84);
          auVar99._8_4_ = 0xffffffff;
          auVar99._0_8_ = 0xffffffffffffffff;
          auVar99._12_4_ = 0xffffffff;
          auVar99 = (auVar96 | auVar122 & auVar119) ^ auVar99;
          auVar119 = packssdw(auVar99,auVar99);
          auVar119 = packsswb(auVar119,auVar119);
          if ((auVar119._6_2_ >> 8 & 1) != 0) {
            local_4036[uVar53 * 2 + lVar79 + 0xf] = 0;
          }
          auVar119 = (auVar117 | _DAT_0015fcc0) ^ _DAT_0015b090;
          auVar111._0_4_ = -(uint)(iVar42 < auVar119._0_4_);
          auVar111._4_4_ = -(uint)(iVar43 < auVar119._4_4_);
          auVar111._8_4_ = -(uint)(iVar44 < auVar119._8_4_);
          auVar111._12_4_ = -(uint)(iVar121 < auVar119._12_4_);
          auVar24._4_4_ = auVar111._0_4_;
          auVar24._0_4_ = auVar111._0_4_;
          auVar24._8_4_ = auVar111._8_4_;
          auVar24._12_4_ = auVar111._8_4_;
          auVar122 = pshuflw(auVar137,auVar24,0xe8);
          auVar100._0_4_ = -(uint)(auVar119._0_4_ == iVar42);
          auVar100._4_4_ = -(uint)(auVar119._4_4_ == iVar43);
          auVar100._8_4_ = -(uint)(auVar119._8_4_ == iVar44);
          auVar100._12_4_ = -(uint)(auVar119._12_4_ == iVar121);
          auVar129._4_4_ = auVar100._4_4_;
          auVar129._0_4_ = auVar100._4_4_;
          auVar129._8_4_ = auVar100._12_4_;
          auVar129._12_4_ = auVar100._12_4_;
          auVar119 = pshuflw(auVar100,auVar129,0xe8);
          auVar130._4_4_ = auVar111._4_4_;
          auVar130._0_4_ = auVar111._4_4_;
          auVar130._8_4_ = auVar111._12_4_;
          auVar130._12_4_ = auVar111._12_4_;
          auVar96 = pshuflw(auVar111,auVar130,0xe8);
          auVar112._8_4_ = 0xffffffff;
          auVar112._0_8_ = 0xffffffffffffffff;
          auVar112._12_4_ = 0xffffffff;
          auVar112 = (auVar96 | auVar119 & auVar122) ^ auVar112;
          auVar96 = packssdw(auVar112,auVar112);
          auVar119 = packsswb(auVar119 & auVar122,auVar96);
          if ((auVar119 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_4036[uVar53 * 2 + lVar79 + 0x11] = 0;
          }
          auVar25._4_4_ = auVar111._0_4_;
          auVar25._0_4_ = auVar111._0_4_;
          auVar25._8_4_ = auVar111._8_4_;
          auVar25._12_4_ = auVar111._8_4_;
          auVar130 = auVar129 & auVar25 | auVar130;
          auVar96 = packssdw(auVar130,auVar130);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar96 = packssdw(auVar96 ^ auVar13,auVar96 ^ auVar13);
          auVar119 = packsswb(auVar119,auVar96);
          if ((auVar119._8_2_ >> 8 & 1) != 0) {
            local_4036[uVar53 * 2 + lVar79 + 0x13] = 0;
          }
          auVar119 = (auVar117 | _DAT_0015fcb0) ^ _DAT_0015b090;
          auVar113._0_4_ = -(uint)(iVar42 < auVar119._0_4_);
          auVar113._4_4_ = -(uint)(iVar43 < auVar119._4_4_);
          auVar113._8_4_ = -(uint)(iVar44 < auVar119._8_4_);
          auVar113._12_4_ = -(uint)(iVar121 < auVar119._12_4_);
          auVar131._4_4_ = auVar113._0_4_;
          auVar131._0_4_ = auVar113._0_4_;
          auVar131._8_4_ = auVar113._8_4_;
          auVar131._12_4_ = auVar113._8_4_;
          iVar135 = -(uint)(auVar119._4_4_ == iVar43);
          iVar139 = -(uint)(auVar119._12_4_ == iVar121);
          auVar26._4_4_ = iVar135;
          auVar26._0_4_ = iVar135;
          auVar26._8_4_ = iVar139;
          auVar26._12_4_ = iVar139;
          auVar138._4_4_ = auVar113._4_4_;
          auVar138._0_4_ = auVar113._4_4_;
          auVar138._8_4_ = auVar113._12_4_;
          auVar138._12_4_ = auVar113._12_4_;
          auVar119 = auVar26 & auVar131 | auVar138;
          auVar119 = packssdw(auVar119,auVar119);
          auVar14._8_4_ = 0xffffffff;
          auVar14._0_8_ = 0xffffffffffffffff;
          auVar14._12_4_ = 0xffffffff;
          auVar119 = packssdw(auVar119 ^ auVar14,auVar119 ^ auVar14);
          auVar119 = packsswb(auVar119,auVar119);
          if ((auVar119 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            local_4036[uVar53 * 2 + lVar79 + 0x15] = 0;
          }
          auVar119 = pshufhw(auVar119,auVar131,0x84);
          auVar27._4_4_ = iVar135;
          auVar27._0_4_ = iVar135;
          auVar27._8_4_ = iVar139;
          auVar27._12_4_ = iVar139;
          auVar122 = pshufhw(auVar113,auVar27,0x84);
          auVar96 = pshufhw(auVar119,auVar138,0x84);
          auVar101._8_4_ = 0xffffffff;
          auVar101._0_8_ = 0xffffffffffffffff;
          auVar101._12_4_ = 0xffffffff;
          auVar101 = (auVar96 | auVar122 & auVar119) ^ auVar101;
          auVar119 = packssdw(auVar101,auVar101);
          auVar119 = packsswb(auVar119,auVar119);
          if ((auVar119._10_2_ >> 8 & 1) != 0) {
            local_4036[uVar53 * 2 + lVar79 + 0x17] = 0;
          }
          auVar119 = (auVar117 | _DAT_0015fca0) ^ _DAT_0015b090;
          auVar114._0_4_ = -(uint)(iVar42 < auVar119._0_4_);
          auVar114._4_4_ = -(uint)(iVar43 < auVar119._4_4_);
          auVar114._8_4_ = -(uint)(iVar44 < auVar119._8_4_);
          auVar114._12_4_ = -(uint)(iVar121 < auVar119._12_4_);
          auVar28._4_4_ = auVar114._0_4_;
          auVar28._0_4_ = auVar114._0_4_;
          auVar28._8_4_ = auVar114._8_4_;
          auVar28._12_4_ = auVar114._8_4_;
          auVar122 = pshuflw(auVar138,auVar28,0xe8);
          auVar102._0_4_ = -(uint)(auVar119._0_4_ == iVar42);
          auVar102._4_4_ = -(uint)(auVar119._4_4_ == iVar43);
          auVar102._8_4_ = -(uint)(auVar119._8_4_ == iVar44);
          auVar102._12_4_ = -(uint)(auVar119._12_4_ == iVar121);
          auVar132._4_4_ = auVar102._4_4_;
          auVar132._0_4_ = auVar102._4_4_;
          auVar132._8_4_ = auVar102._12_4_;
          auVar132._12_4_ = auVar102._12_4_;
          auVar119 = pshuflw(auVar102,auVar132,0xe8);
          auVar133._4_4_ = auVar114._4_4_;
          auVar133._0_4_ = auVar114._4_4_;
          auVar133._8_4_ = auVar114._12_4_;
          auVar133._12_4_ = auVar114._12_4_;
          auVar96 = pshuflw(auVar114,auVar133,0xe8);
          auVar15._8_4_ = 0xffffffff;
          auVar15._0_8_ = 0xffffffffffffffff;
          auVar15._12_4_ = 0xffffffff;
          auVar119 = packssdw(auVar119 & auVar122,(auVar96 | auVar119 & auVar122) ^ auVar15);
          auVar119 = packsswb(auVar119,auVar119);
          if ((auVar119 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_4036[uVar53 * 2 + lVar79 + 0x19] = 0;
          }
          auVar29._4_4_ = auVar114._0_4_;
          auVar29._0_4_ = auVar114._0_4_;
          auVar29._8_4_ = auVar114._8_4_;
          auVar29._12_4_ = auVar114._8_4_;
          auVar133 = auVar132 & auVar29 | auVar133;
          auVar96 = packssdw(auVar133,auVar133);
          auVar16._8_4_ = 0xffffffff;
          auVar16._0_8_ = 0xffffffffffffffff;
          auVar16._12_4_ = 0xffffffff;
          auVar119 = packssdw(auVar119,auVar96 ^ auVar16);
          auVar119 = packsswb(auVar119,auVar119);
          if ((auVar119._12_2_ >> 8 & 1) != 0) {
            local_4036[uVar53 * 2 + lVar79 + 0x1b] = 0;
          }
          auVar119 = (auVar117 | _DAT_0015fc90) ^ _DAT_0015b090;
          auVar103._0_4_ = -(uint)(iVar42 < auVar119._0_4_);
          auVar103._4_4_ = -(uint)(iVar43 < auVar119._4_4_);
          auVar103._8_4_ = -(uint)(iVar44 < auVar119._8_4_);
          auVar103._12_4_ = -(uint)(iVar121 < auVar119._12_4_);
          auVar134._4_4_ = auVar103._0_4_;
          auVar134._0_4_ = auVar103._0_4_;
          auVar134._8_4_ = auVar103._8_4_;
          auVar134._12_4_ = auVar103._8_4_;
          auVar118._4_4_ = -(uint)(auVar119._4_4_ == iVar43);
          auVar118._12_4_ = -(uint)(auVar119._12_4_ == iVar121);
          auVar118._0_4_ = auVar118._4_4_;
          auVar118._8_4_ = auVar118._12_4_;
          auVar120._4_4_ = auVar103._4_4_;
          auVar120._0_4_ = auVar103._4_4_;
          auVar120._8_4_ = auVar103._12_4_;
          auVar120._12_4_ = auVar103._12_4_;
          auVar96 = auVar118 & auVar134 | auVar120;
          auVar119 = packssdw(auVar103,auVar96);
          auVar17._8_4_ = 0xffffffff;
          auVar17._0_8_ = 0xffffffffffffffff;
          auVar17._12_4_ = 0xffffffff;
          auVar119 = packssdw(auVar119 ^ auVar17,auVar119 ^ auVar17);
          auVar119 = packsswb(auVar119,auVar119);
          if ((auVar119 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_4036[uVar53 * 2 + lVar79 + 0x1d] = 0;
          }
          auVar119 = pshufhw(auVar119,auVar134,0x84);
          in_XMM2 = pshufhw(auVar96,auVar118,0x84);
          in_XMM2 = in_XMM2 & auVar119;
          auVar119 = pshufhw(auVar119,auVar120,0x84);
          auVar104._8_4_ = 0xffffffff;
          auVar104._0_8_ = 0xffffffffffffffff;
          auVar104._12_4_ = 0xffffffff;
          auVar104 = (auVar119 | in_XMM2) ^ auVar104;
          auVar119 = packssdw(auVar104,auVar104);
          in_XMM1 = packsswb(auVar119,auVar119);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            local_4036[uVar53 * 2 + lVar79 + 0x1f] = 0;
          }
          uVar53 = uVar53 + 0x10;
        } while ((((long)local_43c0 - uVar54) + 0xf & 0xfffffffffffffff0) != uVar53);
      }
      lVar79 = 0;
      memset(local_3420,0,0x1200);
      local_4360 = dec->qmf_state;
      uVar54 = 0;
      do {
        bVar41 = local_4038;
        local_4390 = lVar79;
        local_4368 = (uint8_t *)uVar54;
        local_43b0 = local_3420 + (int)uVar54;
        uVar51 = local_4380->layer;
        local_43c8 = (L3_gr_info_t *)(ulong)local_4038;
        uVar75 = (uint)local_4038;
        local_43b8 = (L3_gr_info_t *)((long)(int)uVar51 | 1);
        uVar54 = (ulong)uVar51 | 1;
        iVar42 = 0x240;
        pbVar65 = (byte *)0x0;
        bVar74 = local_4038;
        do {
          if (bVar74 == 0) {
            bVar74 = 0;
          }
          else {
            local_43c0 = pbVar65;
            pfVar56 = local_43b0 + (long)pbVar65 * (long)local_43b8;
            lVar79 = 0;
            do {
              bVar74 = local_4036[lVar79];
              if (bVar74 != 0) {
                if (bVar74 < 0x11) {
                  if (-1 < (int)uVar51) {
                    uVar53 = 0;
                    do {
                      uVar46 = get_bits(&local_43a8,(uint)bVar74);
                      pfVar56[uVar53] = (float)(int)(uVar46 + (-1 << (bVar74 - 1 & 0x1f)) + 1);
                      uVar53 = uVar53 + 1;
                    } while (uVar54 != uVar53);
                  }
                }
                else {
                  uVar78 = 2 << (bVar74 - 0x11 & 0x1f);
                  uVar46 = get_bits(&local_43a8,(uVar78 - (uVar78 >> 3)) + 3);
                  if (-1 < (int)uVar51) {
                    uVar53 = 0;
                    do {
                      pfVar56[uVar53] = (float)(int)(uVar46 % (uVar78 + 1) - (uVar78 >> 1));
                      uVar53 = uVar53 + 1;
                      uVar46 = uVar46 / (uVar78 + 1);
                    } while (uVar54 != uVar53);
                  }
                }
              }
              pfVar56 = pfVar56 + iVar42;
              iVar42 = 0x12 - iVar42;
              lVar79 = lVar79 + 1;
              pbVar65 = local_43c0;
              bVar74 = bVar41;
            } while (lVar79 != (ulong)(uVar75 * 2) + (ulong)((ulong)(uVar75 * 2) == 0));
          }
          pLVar66 = local_43c8;
          pbVar65 = (byte *)((long)pbVar65 + 1);
        } while (pbVar65 != (byte *)0x4);
        uVar51 = (int)local_4368 + (int)uVar54 * 4;
        uVar54 = (ulong)uVar51;
        if (uVar51 == 0xc) {
          memcpy(local_2b20 + (uint)local_4037 * 0x48,
                 (void *)((ulong)((uint)local_4037 * 0x48) + (long)local_3420),
                 ((long)local_43c8 - (ulong)local_4037) * 0x48);
          pmVar40 = local_4378;
          uVar53 = local_4390;
          if (bVar41 != 0) {
            pfVar71 = (float *)(&local_4338 + local_4390);
            iVar42 = 0;
            pfVar56 = local_3420;
            do {
              fVar84 = *pfVar71;
              fVar87 = pfVar71[3];
              lVar79 = 0;
              do {
                pfVar61 = pfVar56 + lVar79;
                fVar88 = pfVar61[1];
                fVar30 = pfVar61[2];
                fVar31 = pfVar61[3];
                pfVar55 = pfVar56 + lVar79;
                *pfVar55 = *pfVar61 * fVar84;
                pfVar55[1] = fVar88 * fVar84;
                pfVar55[2] = fVar30 * fVar84;
                pfVar55[3] = fVar31 * fVar84;
                pfVar61 = pfVar56 + lVar79 + 0x240;
                auVar115._0_4_ = *pfVar61 * fVar87;
                auVar115._4_4_ = pfVar61[1] * fVar87;
                auVar115._8_4_ = pfVar61[2] * fVar87;
                auVar115._12_4_ = pfVar61[3] * fVar87;
                *(undefined1 (*) [16])(pfVar56 + lVar79 + 0x240) = auVar115;
                lVar79 = lVar79 + 4;
              } while (lVar79 != 0xc);
              iVar42 = iVar42 + 1;
              pfVar56 = pfVar56 + 0x12;
              pfVar71 = pfVar71 + 6;
            } while (iVar42 != (int)pLVar66);
          }
          mp3d_synth_granule(local_4360,local_3420,0xc,(int)local_4370,local_4378,local_2180);
          uVar54 = 0;
          memset(local_3420,0,0x1200);
          local_4370 = (long)local_4380->channels;
          local_4378 = pmVar40 + (long)local_4380->channels * 0x180;
          local_4390 = uVar53;
        }
        if (local_43a8.limit < local_43a8.pos) goto LAB_001436b0;
        lVar79 = local_4390 + 1;
      } while (lVar79 != 3);
      uVar51 = 1;
    }
    uVar75 = 0x180;
    if ((~dec->header[1] & 6) != 0) {
      uVar75 = 0x480 >> ((dec->header[1] & 0xe) == 2);
    }
    uVar51 = uVar75 * uVar51;
  }
  return uVar51;
LAB_0014422d:
  local_3fb0.pos = (uint)local_4390;
  uVar54 = local_4370 + 1;
  if ((float *)uVar54 == local_4360) goto LAB_00144252;
  goto LAB_001438ee;
}

Assistant:

int mp3dec_decode_frame(mp3dec_t *dec, const uint8_t *mp3, int mp3_bytes, mp3d_sample_t *pcm, mp3dec_frame_info_t *info)
{
    int i = 0, igr, frame_size = 0, success = 1;
    const uint8_t *hdr;
    bs_t bs_frame[1];
    mp3dec_scratch_t scratch;

    if (mp3_bytes > 4 && dec->header[0] == 0xff && hdr_compare(dec->header, mp3))
    {
        frame_size = hdr_frame_bytes(mp3, dec->free_format_bytes) + hdr_padding(mp3);
        if (frame_size != mp3_bytes && (frame_size + HDR_SIZE > mp3_bytes || !hdr_compare(mp3, mp3 + frame_size)))
        {
            frame_size = 0;
        }
    }
    if (!frame_size)
    {
        memset(dec, 0, sizeof(mp3dec_t));
        i = mp3d_find_frame(mp3, mp3_bytes, &dec->free_format_bytes, &frame_size);
        if (!frame_size || i + frame_size > mp3_bytes)
        {
            info->frame_bytes = i;
            return 0;
        }
    }

    hdr = mp3 + i;
    memcpy(dec->header, hdr, HDR_SIZE);
    info->frame_bytes = i + frame_size;
    info->frame_offset = i;
    info->channels = HDR_IS_MONO(hdr) ? 1 : 2;
    info->hz = hdr_sample_rate_hz(hdr);
    info->layer = 4 - HDR_GET_LAYER(hdr);
    info->bitrate_kbps = hdr_bitrate_kbps(hdr);

    if (!pcm)
    {
        return hdr_frame_samples(hdr);
    }

    bs_init(bs_frame, hdr + HDR_SIZE, frame_size - HDR_SIZE);
    if (HDR_IS_CRC(hdr))
    {
        get_bits(bs_frame, 16);
    }

    if (info->layer == 3)
    {
        int main_data_begin = L3_read_side_info(bs_frame, scratch.gr_info, hdr);
        if (main_data_begin < 0 || bs_frame->pos > bs_frame->limit)
        {
            mp3dec_init(dec);
            return 0;
        }
        success = L3_restore_reservoir(dec, bs_frame, &scratch, main_data_begin);
        if (success)
        {
            for (igr = 0; igr < (HDR_TEST_MPEG1(hdr) ? 2 : 1); igr++, pcm += 576*info->channels)
            {
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                L3_decode(dec, &scratch, scratch.gr_info + igr*info->channels, info->channels);
                mp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 18, info->channels, pcm, scratch.syn[0]);
            }
        }
        L3_save_reservoir(dec, &scratch);
    } else
    {
#ifdef MINIMP3_ONLY_MP3
        return 0;
#else /* MINIMP3_ONLY_MP3 */
        L12_scale_info sci[1];
        L12_read_scale_info(hdr, bs_frame, sci);

        memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
        for (i = 0, igr = 0; igr < 3; igr++)
        {
            if (12 == (i += L12_dequantize_granule(scratch.grbuf[0] + i, bs_frame, sci, info->layer | 1)))
            {
                i = 0;
                L12_apply_scf_384(sci, sci->scf + igr, scratch.grbuf[0]);
                mp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 12, info->channels, pcm, scratch.syn[0]);
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                pcm += 384*info->channels;
            }
            if (bs_frame->pos > bs_frame->limit)
            {
                mp3dec_init(dec);
                return 0;
            }
        }
#endif /* MINIMP3_ONLY_MP3 */
    }
    return success*hdr_frame_samples(dec->header);
}